

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t>
               (AllocatorType *allocator,size_t count,char16_t *obj)

{
  code *pcVar1;
  bool bVar2;
  long extraout_RDX;
  undefined8 *in_FS_OFFSET;
  code *local_48;
  FreeFuncType freeFunc;
  char16_t *obj_local;
  size_t count_local;
  AllocatorType *allocator_local;
  
  if ((count != 0) && (DestructArray<char16_t>(count,obj), (count << 1) / count != 2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x195,"(count * sizeof(T) / count == sizeof(T))",
                       "count * sizeof(T) / count == sizeof(T)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  local_48 = (code *)TypeAllocatorFunc<Memory::NoCheckHeapAllocator,_char16_t>::GetFreeFunc();
  if (((ulong)local_48 & 1) != 0) {
    local_48 = *(code **)(local_48 + *(long *)(allocator + extraout_RDX) + -1);
  }
  (*local_48)(allocator + extraout_RDX,obj,count << 1);
  return;
}

Assistant:

void DeleteArray(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, size_t count, T * obj)
{
    if (count == 0 && AllocatorInfo<TAllocator, T>::AllocatorType::FakeZeroLengthArray)
    {
        return;
    }

    if (count != 0)
    {
        DestructArray(count, obj);

        // DeleteArray can only be called when an array is allocated successfully.
        // So the add should never overflow
        Assert(count * sizeof(T) / count == sizeof(T));
    }

    auto freeFunc = AllocatorInfo<TAllocator, T>::AllocatorFunc::GetFreeFunc();
    (allocator->*freeFunc)((void *)obj, sizeof(T) * count);
}